

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

void __thiscall SQLite::Statement::bindNoCopy(Statement *this,int aIndex,char *apValue)

{
  int aRet;
  
  aRet = sqlite3_bind_text((this->mStmtPtr).mpStmt,aIndex,apValue,-1,(_func_void_void_ptr *)0x0);
  check(this,aRet);
  return;
}

Assistant:

void Statement::bindNoCopy(const int aIndex, const char* apValue)
{
    const int ret = sqlite3_bind_text(mStmtPtr, aIndex, apValue, -1, SQLITE_STATIC);
    check(ret);
}